

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutionReport.h
# Opt level: O1

void __thiscall
FIX42::ExecutionReport::ExecutionReport
          (ExecutionReport *this,OrderID *aOrderID,ExecID *aExecID,ExecTransType *aExecTransType,
          ExecType *aExecType,OrdStatus *aOrdStatus,Symbol *aSymbol,Side *aSide,
          LeavesQty *aLeavesQty,CumQty *aCumQty,AvgPx *aAvgPx)

{
  FieldBase local_88;
  
  MsgType();
  FIX42::Message::Message(&this->super_Message,(MsgType *)&local_88);
  FIX::FieldBase::~FieldBase(&local_88);
  *(undefined ***)&this->super_Message = &PTR__Message_00329390;
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrderID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aExecID,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aExecTransType,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aExecType,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aOrdStatus,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSymbol,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aSide,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aLeavesQty,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aCumQty,true);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)aAvgPx,true);
  return;
}

Assistant:

ExecutionReport(
      const FIX::OrderID& aOrderID,
      const FIX::ExecID& aExecID,
      const FIX::ExecTransType& aExecTransType,
      const FIX::ExecType& aExecType,
      const FIX::OrdStatus& aOrdStatus,
      const FIX::Symbol& aSymbol,
      const FIX::Side& aSide,
      const FIX::LeavesQty& aLeavesQty,
      const FIX::CumQty& aCumQty,
      const FIX::AvgPx& aAvgPx )
    : Message(MsgType())
    {
      set(aOrderID);
      set(aExecID);
      set(aExecTransType);
      set(aExecType);
      set(aOrdStatus);
      set(aSymbol);
      set(aSide);
      set(aLeavesQty);
      set(aCumQty);
      set(aAvgPx);
    }